

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O1

void outflushn_stream(out_stream_info *stream,int nl)

{
  char *pcVar1;
  byte bVar2;
  char cVar3;
  int iVar4;
  bool bVar5;
  uint uVar6;
  ushort **ppuVar7;
  size_t sVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  char *txt;
  
  pcVar1 = stream->linebuf;
  bVar2 = stream->linepos;
  uVar11 = (ulong)bVar2;
  stream->linebuf[uVar11] = '\0';
  uVar10 = bVar2 - 1;
  uVar6 = uVar10;
  if ((nl & 0xfffffffbU) != 0 && bVar2 != 0) {
    do {
      iVar9 = (int)uVar11;
      cVar3 = pcVar1[iVar9 - 1U];
      uVar6 = iVar9 - 1U;
      if (((long)cVar3 < 0) ||
         (ppuVar7 = __ctype_b_loc(), uVar6 = uVar10,
         (*(byte *)((long)*ppuVar7 + (long)cVar3 * 2 + 1) & 0x20) == 0)) goto LAB_001307f6;
      uVar10 = uVar10 - 1;
      uVar11 = (ulong)(iVar9 - 1U);
    } while (iVar9 - 1U != 0 && 0 < iVar9);
    uVar6 = 0xffffffff;
  }
LAB_001307f6:
  if (nl == 3) {
    iVar9 = stream->preview;
    if (iVar9 <= (int)uVar6) {
      t_outline(stream,0,pcVar1 + iVar9,stream->attrbuf + iVar9);
      iVar9 = stream->preview;
      sVar8 = strlen(pcVar1 + iVar9);
      stream->preview = (int)sVar8 + iVar9;
    }
    goto LAB_0013093c;
  }
  pcVar1[uVar6 + 1] = '\0';
  if (nl == 2) {
    bVar5 = false;
    txt = " ";
LAB_00130881:
    iVar9 = 0;
  }
  else {
    if (nl != 1) {
      txt = (char *)0x0;
      bVar5 = true;
      goto LAB_00130881;
    }
    iVar9 = 1;
    txt = "\n";
    if ((stream->linecol == '\0') && (stream->just_did_nl != 0)) {
      bVar5 = false;
      if (stream->html_pre_level == 0) {
        bVar5 = true;
        txt = (char *)0x0;
        goto LAB_00130881;
      }
    }
    else {
      bVar5 = false;
    }
  }
  iVar4 = stream->preview;
  if (((stream->linebuf[iVar4] != '\0') ||
      (((stream->linecol != '\0' && (stream->just_did_nl == 0)) || (0 < stream->html_pre_level))))
     && (t_outline(stream,iVar9,pcVar1 + iVar4,stream->attrbuf + iVar4), !bVar5)) {
    t_outline(stream,0,txt,(int *)0x0);
  }
  if (((nl == 1) && (stream->html_mode != 0)) && (stream->html_target != 0)) {
    t_outline(stream,0,"<BR HEIGHT=0>",(int *)0x0);
  }
  if (nl == 0) {
    os_flush();
  }
  else {
    stream->linecol = '\0';
  }
  stream->preview = 0;
  stream->linepos = '\0';
  if (nl == 1) {
    stream->just_did_nl = 1;
  }
  else if (*pcVar1 != '\0') {
    stream->just_did_nl = 0;
  }
LAB_0013093c:
  if (stream->cur_attr != stream->os_attr) {
    os_set_text_attr(stream->cur_attr);
    stream->os_attr = stream->cur_attr;
  }
  return;
}

Assistant:

static void outflushn_stream(out_stream_info *stream, int nl)
{
    int i;

    /* null-terminate the current output line buffer */
    stream->linebuf[stream->linepos] = '\0';

    /* note the position of the last character to display */
    i = stream->linepos - 1;

    /* if we're adding anything, remove trailing spaces */
    if (nl != 0 && nl != 4)
    {
        /* look for last non-space character */
        for ( ; i >= 0 && outissp(stream->linebuf[i]) ; --i) ;
    }

    /* check the output mode */
    if (nl == 3)
    {
        /* 
         *   this is the special "preview" mode -- only display the part
         *   that we haven't already previewed for this same line
         */
        if (i + 1 > stream->preview)
        {
            /* write out the line */
            t_outline(stream, 0, &stream->linebuf[stream->preview],
                      &stream->attrbuf[stream->preview]);

            /* skip past the part we wrote */
            stream->preview += strlen(&stream->linebuf[stream->preview]);
        }
    }
    else
    {
        char *suffix;           /* extra text to add after the flushed text */
        int   countnl = 0;         /* true if line counts for [more] paging */

        /* null-terminate the buffer at the current position */
        stream->linebuf[++i] = '\0';

        /* check the mode */
        switch(nl)
        {
        case 0:
        case 3:
        case 4:
            /* no newline - just flush out what we have with no suffix */
            suffix = 0;
            break;

        case 1:
            /* 
             *   Add a newline.  If there's nothing in the current line,
             *   or we just wrote out a newline, do not add an extra
             *   newline.  Keep all newlines in PRE mode.
             */
            if (stream->linecol != 0 || !stream->just_did_nl
                || stream->html_pre_level != 0)
            {
                /* add a newline after the text */
                suffix = "\n";
                
                /* count the line in the page size */
                countnl = 1;
            }
            else
            {
                /* don't add a newline */
                suffix = 0;
            }
            break;

        case 2:
            /* 
             *   we're going to depend on the underlying OS output layer
             *   to do line breaking, so don't add a newline, but do add a
             *   space, so that the underlying OS layer knows we have a
             *   word break here 
             */
            suffix = " ";
            break;
        }

        /* 
         *   display the line, as long as we have something buffered to
         *   display; even if we don't, display it if our column is
         *   non-zero and we didn't just do a newline, since this must
         *   mean that we've flushed a partial line and are just now doing
         *   the newline 
         */
        if (stream->linebuf[stream->preview] != '\0'
            || (stream->linecol != 0 && !stream->just_did_nl)
            || stream->html_pre_level > 0)
        {
            /* write it out */
            t_outline(stream, countnl, &stream->linebuf[stream->preview],
                      &stream->attrbuf[stream->preview]);

            /* write the suffix, if any */
            if (suffix != 0)
                t_outline(stream, 0, suffix, 0);
        }

        /* generate an HTML line break if necessary */
        if (nl == 1 && stream->html_mode && stream->html_target)
            t_outline(stream, 0, "<BR HEIGHT=0>", 0);

        if (nl == 0)
        {
            /* we're not displaying a newline, so flush what we have */
            os_flush();
        }
        else
        {
            /* we displayed a newline, so reset the column position */
            stream->linecol = 0;
        }

        /* reset the line output buffer position */
        stream->linepos = stream->preview = 0;

        /* 
         *   If we just output a newline, note it.  If we didn't just
         *   output a newline, but we did write out anything else, note
         *   that we're no longer at the start of a line on the underlying
         *   output device.  
         */
        if (nl == 1)
            stream->just_did_nl = TRUE;
        else if (stream->linebuf[stream->preview] != '\0')
            stream->just_did_nl = FALSE;
    }

    /* 
     *   If the osifc-level attributes don't match the current attributes,
     *   bring the osifc layer up to date.  This is necessary in cases where
     *   we set attributes immediately before asking for input - we
     *   essentially need to flush the attributes without flushing any text.
     */
    if (stream->cur_attr != stream->os_attr)
    {
        /* set the osifc attributes */
        os_set_text_attr(stream->cur_attr);

        /* remember the new attributes as the current osifc attributes */
        stream->os_attr = stream->cur_attr;
    }
}